

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O2

int nni_ipc_listener_alloc(nng_stream_listener **lp,nng_url *url)

{
  char *__s1;
  int iVar1;
  nng_stream_listener *ptr;
  size_t sVar2;
  size_t sVar3;
  
  ptr = (nng_stream_listener *)nni_zalloc(0x168);
  if (ptr == (nng_stream_listener *)0x0) {
    return 2;
  }
  __s1 = url->u_scheme;
  iVar1 = strcmp(__s1,"ipc");
  if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"unix"), iVar1 == 0)) {
    if ((url->u_path != (char *)0x0) &&
       (sVar3 = strlen(url->u_path), 0xffffffffffffff7f < sVar3 - 0x81)) {
      *(undefined2 *)&ptr[1].sl_get_tls = 2;
      nni_strlcpy((char *)((long)&ptr[1].sl_get_tls + 2),url->u_path,0x80);
      goto LAB_00132877;
    }
  }
  else {
    iVar1 = strcmp(__s1,"abstract");
    if ((iVar1 == 0) &&
       (sVar2 = nni_url_decode((uint8_t *)((long)&ptr[1].sl_get_tls + 4),url->u_path,0x6b),
       sVar2 != 0xffffffffffffffff)) {
      *(undefined2 *)&ptr[1].sl_get_tls = 5;
      *(short *)((long)&ptr[1].sl_get_tls + 2) = (short)sVar2;
LAB_00132877:
      nni_mtx_init((nni_mtx *)(ptr + 4));
      nni_aio_list_init((nni_list *)&ptr[3].sl_accept);
      *(undefined2 *)&ptr[3].sl_get_tls = 0;
      *(undefined4 *)&ptr[3].sl_set_security_descriptor = 0;
      ptr->sl_free = ipc_listener_free;
      ptr->sl_close = ipc_listener_close;
      ptr->sl_stop = ipc_listener_stop;
      ptr->sl_listen = ipc_listener_listen;
      ptr->sl_accept = ipc_listener_accept;
      ptr->sl_get = ipc_listener_get;
      ptr->sl_set = ipc_listener_set;
      *lp = ptr;
      return 0;
    }
  }
  nni_free(ptr,0x168);
  return 0xf;
}

Assistant:

int
nni_ipc_listener_alloc(nng_stream_listener **lp, const nng_url *url)
{
	ipc_listener *l;
	size_t        len;

	if ((l = NNI_ALLOC_STRUCT(l)) == NULL) {
		return (NNG_ENOMEM);
	}

	if ((strcmp(url->u_scheme, "ipc") == 0) ||
	    (strcmp(url->u_scheme, "unix") == 0)) {
		if ((url->u_path == NULL) ||
		    ((len = strlen(url->u_path)) == 0) ||
		    (len > NNG_MAXADDRLEN)) {
			NNI_FREE_STRUCT(l);
			return (NNG_EADDRINVAL);
		}
		l->sa.s_ipc.sa_family = NNG_AF_IPC;
		nni_strlcpy(l->sa.s_ipc.sa_path, url->u_path, NNG_MAXADDRLEN);

#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	} else if (strcmp(url->u_scheme, "abstract") == 0) {
		// path is url encoded.
		len = nni_url_decode(l->sa.s_abstract.sa_name, url->u_path,
		    sizeof(l->sa.s_abstract.sa_name));
		if (len == (size_t) -1) {
			NNI_FREE_STRUCT(l);
			return (NNG_EADDRINVAL);
		}

		l->sa.s_abstract.sa_family = NNG_AF_ABSTRACT;
		l->sa.s_abstract.sa_len    = len;
#endif

	} else {
		NNI_FREE_STRUCT(l);
		return (NNG_EADDRINVAL);
	}

	nni_mtx_init(&l->mtx);
	nni_aio_list_init(&l->acceptq);

	l->closed       = false;
	l->started      = false;
	l->perms        = 0;
	l->sl.sl_free   = ipc_listener_free;
	l->sl.sl_close  = ipc_listener_close;
	l->sl.sl_stop   = ipc_listener_stop;
	l->sl.sl_listen = ipc_listener_listen;
	l->sl.sl_accept = ipc_listener_accept;
	l->sl.sl_get    = ipc_listener_get;
	l->sl.sl_set    = ipc_listener_set;

	*lp = (void *) l;
	return (0);
}